

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::AddDefaultCommands(cmake *this)

{
  cmState *this_00;
  bool bVar1;
  reference ppcVar2;
  __normal_iterator<cmCommand_**,_std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>_> local_48;
  __normal_iterator<cmCommand_**,_std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>_> local_40;
  iterator i;
  undefined1 local_28 [8];
  vector<cmCommand_*,_std::allocator<cmCommand_*>_> commands;
  cmake *this_local;
  
  commands.super__Vector_base<cmCommand_*,_std::allocator<cmCommand_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::vector
            ((vector<cmCommand_*,_std::allocator<cmCommand_*>_> *)local_28);
  GetBootstrapCommands1((vector<cmCommand_*,_std::allocator<cmCommand_*>_> *)local_28);
  GetBootstrapCommands2((vector<cmCommand_*,_std::allocator<cmCommand_*>_> *)local_28);
  GetPredefinedCommands((vector<cmCommand_*,_std::allocator<cmCommand_*>_> *)local_28);
  local_40._M_current =
       (cmCommand **)
       std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::begin
                 ((vector<cmCommand_*,_std::allocator<cmCommand_*>_> *)local_28);
  while( true ) {
    local_48._M_current =
         (cmCommand **)
         std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::end
                   ((vector<cmCommand_*,_std::allocator<cmCommand_*>_> *)local_28);
    bVar1 = __gnu_cxx::operator!=(&local_40,&local_48);
    if (!bVar1) break;
    this_00 = this->State;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmCommand_**,_std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>_>
              ::operator*(&local_40);
    cmState::AddCommand(this_00,*ppcVar2);
    __gnu_cxx::
    __normal_iterator<cmCommand_**,_std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>_>::
    operator++(&local_40);
  }
  std::vector<cmCommand_*,_std::allocator<cmCommand_*>_>::~vector
            ((vector<cmCommand_*,_std::allocator<cmCommand_*>_> *)local_28);
  return;
}

Assistant:

void cmake::AddDefaultCommands()
{
  std::vector<cmCommand*> commands;
  GetBootstrapCommands1(commands);
  GetBootstrapCommands2(commands);
  GetPredefinedCommands(commands);
  for(std::vector<cmCommand*>::iterator i = commands.begin();
      i != commands.end(); ++i)
    {
    this->State->AddCommand(*i);
    }
}